

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfontdialog.cpp
# Opt level: O0

bool __thiscall QFontDialog::eventFilter(QFontDialog *this,QObject *o,QEvent *e)

{
  bool bVar1;
  Type TVar2;
  int iVar3;
  int iVar4;
  QFontDialogPrivate *__addr_len;
  QStyle *pQVar5;
  QEvent *in_RDX;
  sockaddr *extraout_RDX;
  sockaddr *extraout_RDX_00;
  sockaddr *__addr;
  QFontListView *in_RSI;
  QFontListView *pQVar6;
  QFontListView *in_RDI;
  int ci;
  QKeyEvent *k;
  QFontDialogPrivate *d;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  
  pQVar6 = in_RSI;
  __addr_len = d_func((QFontDialog *)0x795376);
  iVar4 = (int)pQVar6;
  TVar2 = QEvent::type(in_RDX);
  if (TVar2 == KeyPress) {
    if ((in_RSI == (QFontListView *)__addr_len->sizeEdit) &&
       ((((iVar3 = QKeyEvent::key((QKeyEvent *)in_RDX), iVar3 == 0x1000013 ||
          (iVar3 = QKeyEvent::key((QKeyEvent *)in_RDX), iVar3 == 0x1000015)) ||
         (iVar3 = QKeyEvent::key((QKeyEvent *)in_RDX), iVar3 == 0x1000016)) ||
        (iVar3 = QKeyEvent::key((QKeyEvent *)in_RDX), iVar3 == 0x1000017)))) {
      iVar4 = QFontListView::currentItem(in_RDI);
      QCoreApplication::sendEvent((QObject *)__addr_len->sizeList,in_RDX);
      iVar3 = QFontListView::currentItem(in_RDI);
      if (iVar4 != iVar3) {
        pQVar5 = QWidget::style((QWidget *)CONCAT44(iVar4,in_stack_ffffffffffffffb8));
        iVar4 = (**(code **)(*(long *)pQVar5 + 0xf0))(pQVar5,0xd,0,in_RDI);
        if (iVar4 != 0) {
          QLineEdit::selectAll((QLineEdit *)in_RDI);
        }
      }
      return true;
    }
    if (((in_RSI == __addr_len->familyList) || (in_RSI == __addr_len->styleList)) &&
       ((iVar3 = QKeyEvent::key((QKeyEvent *)in_RDX), __addr = extraout_RDX, iVar3 == 0x1000004 ||
        (iVar3 = QKeyEvent::key((QKeyEvent *)in_RDX), __addr = extraout_RDX_00, iVar3 == 0x1000005))
       )) {
      QEvent::accept(in_RDX,iVar4,__addr,(socklen_t *)__addr_len);
      (**(code **)(*(long *)&(in_RDI->super_QListView).super_QAbstractItemView.
                             super_QAbstractScrollArea.super_QFrame.super_QWidget + 0x1b8))();
      return true;
    }
  }
  else {
    TVar2 = QEvent::type(in_RDX);
    if (TVar2 == FocusIn) {
      pQVar5 = QWidget::style((QWidget *)
                              CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
      iVar4 = (**(code **)(*(long *)pQVar5 + 0xf0))(pQVar5,0xd,0,in_RDI);
      if (iVar4 != 0) {
        if (in_RSI == __addr_len->familyList) {
          QLineEdit::selectAll((QLineEdit *)in_RDI);
        }
        else if (in_RSI == __addr_len->styleList) {
          QLineEdit::selectAll((QLineEdit *)in_RDI);
        }
        else if (in_RSI == __addr_len->sizeList) {
          QLineEdit::selectAll((QLineEdit *)in_RDI);
        }
        goto LAB_007955eb;
      }
    }
    TVar2 = QEvent::type(in_RDX);
    if ((TVar2 == MouseButtonPress) && (in_RSI == __addr_len->sizeList)) {
      QWidget::setFocus((QWidget *)0x7955e7);
    }
  }
LAB_007955eb:
  bVar1 = QDialog::eventFilter
                    ((QDialog *)in_RDI,
                     (QObject *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                     (QEvent *)0x7955ff);
  return bVar1;
}

Assistant:

bool QFontDialog::eventFilter(QObject *o , QEvent *e)
{
    Q_D(QFontDialog);
    if (e->type() == QEvent::KeyPress) {
        QKeyEvent *k = static_cast<QKeyEvent *>(e);
        if (o == d->sizeEdit &&
        (k->key() == Qt::Key_Up ||
             k->key() == Qt::Key_Down ||
         k->key() == Qt::Key_PageUp ||
         k->key() == Qt::Key_PageDown)) {

            int ci = d->sizeList->currentItem();
            QCoreApplication::sendEvent(d->sizeList, k);

            if (ci != d->sizeList->currentItem()
                    && style()->styleHint(QStyle::SH_FontDialog_SelectAssociatedText, nullptr, this))
                d->sizeEdit->selectAll();
            return true;
        } else if ((o == d->familyList || o == d->styleList) &&
                    (k->key() == Qt::Key_Return || k->key() == Qt::Key_Enter)) {
            k->accept();
        accept();
            return true;
        }
    } else if (e->type() == QEvent::FocusIn
               && style()->styleHint(QStyle::SH_FontDialog_SelectAssociatedText, nullptr, this)) {
        if (o == d->familyList)
            d->familyEdit->selectAll();
        else if (o == d->styleList)
            d->styleEdit->selectAll();
        else if (o == d->sizeList)
            d->sizeEdit->selectAll();
    } else if (e->type() == QEvent::MouseButtonPress && o == d->sizeList) {
            d->sizeEdit->setFocus();
    }
    return QDialog::eventFilter(o, e);
}